

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

void __thiscall S2BooleanOperation::Impl::~Impl(Impl *this)

{
  pointer pIVar1;
  pointer ppVar2;
  pointer pcVar3;
  
  pIVar1 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1);
  }
  pIVar1 = (this->index_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1);
  }
  ppVar2 = (this->input_crossings_).
           super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  pcVar3 = (this->input_dimensions_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3);
  }
  std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::~unique_ptr(&this->builder_);
  return;
}

Assistant:

explicit Impl(S2BooleanOperation* op)
      : op_(op), index_crossings_first_region_id_(-1) {
  }